

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O3

void aom_lpf_vertical_4_c(uint8_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  char cVar12;
  int iVar13;
  char cVar14;
  uint uVar15;
  char cVar16;
  char cVar17;
  uint uVar18;
  int iVar19;
  
  iVar13 = 4;
  do {
    bVar1 = s[-2];
    bVar2 = s[1];
    cVar8 = bVar1 + 0x80;
    cVar12 = bVar2 + 0x80;
    bVar3 = s[-1];
    bVar4 = *s;
    cVar7 = cVar8 - cVar12;
    if (SBORROW1(cVar8,cVar12)) {
      cVar7 = (-1 < (char)(cVar8 - cVar12)) + '\x7f';
    }
    uVar10 = (uint)bVar1 - (uint)bVar3;
    uVar15 = -uVar10;
    if (0 < (int)uVar10) {
      uVar15 = uVar10;
    }
    uVar15 = uVar15 & 0xff;
    uVar18 = (uint)bVar1 - (uint)bVar2;
    uVar9 = (uint)bVar2 - (uint)bVar4;
    uVar10 = -uVar9;
    if (0 < (int)uVar9) {
      uVar10 = uVar9;
    }
    uVar10 = uVar10 & 0xff;
    uVar11 = (uint)bVar3 - (uint)bVar4;
    uVar9 = -uVar11;
    if (0 < (int)uVar11) {
      uVar9 = uVar11;
    }
    uVar11 = -uVar18;
    if (0 < (int)uVar18) {
      uVar11 = uVar18;
    }
    bVar5 = uVar15 <= *thresh;
    bVar6 = uVar10 <= *thresh;
    iVar19 = (int)cVar7;
    if (bVar5 && bVar6) {
      iVar19 = 0;
    }
    iVar19 = (((int)(char)bVar4 ^ 0xffffff80U) - ((int)(char)bVar3 ^ 0xffffff80U)) * 3 + iVar19;
    if (0x7e < iVar19) {
      iVar19 = 0x7f;
    }
    if (iVar19 < -0x7f) {
      iVar19 = -0x80;
    }
    if ((uint)*blimit < ((uVar11 & 0xff) >> 1) + (uVar9 & 0xff) * 2) {
      iVar19 = 0;
    }
    if (*limit < uVar10) {
      iVar19 = 0;
    }
    if (*limit < uVar15) {
      iVar19 = 0;
    }
    cVar7 = (char)iVar19;
    if (0x7a < iVar19) {
      cVar7 = '{';
    }
    cVar14 = (char)(cVar7 + '\x04') >> 3;
    cVar7 = (char)(cVar14 + '\x01') >> 1;
    if (!bVar5 || !bVar6) {
      cVar7 = '\0';
    }
    cVar16 = ((char)(cVar7 + cVar8) >> 7) + -0x80;
    if (!SCARRY1(cVar8,cVar7)) {
      cVar16 = cVar8 + cVar7;
    }
    cVar8 = cVar12 - cVar7;
    if (SBORROW1(cVar12,cVar7)) {
      cVar8 = (-1 < (char)(cVar12 - cVar7)) + '\x7f';
    }
    if (0x7b < iVar19) {
      iVar19 = 0x7c;
    }
    cVar17 = (char)((char)iVar19 + '\x03') >> 3;
    cVar7 = (char)((int)(char)bVar3 ^ 0xffffff80U);
    cVar12 = ((char)(cVar7 + cVar17) >> 7) + -0x80;
    if (!SCARRY1(cVar17,cVar7)) {
      cVar12 = cVar17 + cVar7;
    }
    cVar17 = (char)((int)(char)bVar4 ^ 0xffffff80U);
    cVar7 = cVar17 - cVar14;
    if (SBORROW1(cVar17,cVar14)) {
      cVar7 = (-1 < (char)(cVar17 - cVar14)) + '\x7f';
    }
    *s = cVar7 + 0x80;
    s[-1] = cVar12 + 0x80;
    s[1] = cVar8 + 0x80;
    s[-2] = cVar16 + 0x80;
    s = s + pitch;
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  return;
}

Assistant:

void aom_lpf_vertical_4_c(uint8_t *s, int pitch, const uint8_t *blimit,
                          const uint8_t *limit, const uint8_t *thresh) {
  int i;
  int count = 4;

  // loop filter designed to work using chars so that we can make maximum use
  // of 8 bit simd instructions.
  for (i = 0; i < count; ++i) {
    const uint8_t p1 = s[-2], p0 = s[-1];
    const uint8_t q0 = s[0], q1 = s[1];
    const int8_t mask = filter_mask2(*limit, *blimit, p1, p0, q0, q1);
    filter4(mask, *thresh, s - 2, s - 1, s, s + 1);
    s += pitch;
  }
}